

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

void Lf_ManSetCutRefs(Lf_Man_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Lf_Man_t *p_local;
  
  iVar1 = Vec_PtrSize(&p->vMemSets);
  iVar2 = Vec_IntSize(&p->vFreeSets);
  if (iVar1 << 0xc != iVar2) {
    iVar1 = Vec_PtrSize(&p->vMemSets);
    iVar2 = Vec_IntSize(&p->vFreeSets);
    printf("The number of used cutsets = %d.\n",(ulong)(uint)(iVar1 * 0x1000 - iVar2));
  }
  local_1c = 0;
  while( true ) {
    bVar4 = false;
    if (local_1c < p->pGia->nObjs) {
      pGStack_18 = Gia_ManObj(p->pGia,local_1c);
      bVar4 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(pGStack_18);
    if (iVar1 != 0) {
      if (pGStack_18->Value != 0) {
        __assert_fail("pObj->Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                      ,0x5af,"void Lf_ManSetCutRefs(Lf_Man_t *)");
      }
      iVar1 = Gia_ObjIsBuf(pGStack_18);
      if (iVar1 == 0) {
        pGVar3 = Gia_ObjFanin0(pGStack_18);
        iVar1 = Gia_ObjIsAndNotBuf(pGVar3);
        if (iVar1 != 0) {
          pGVar3 = Gia_ObjFanin0(pGStack_18);
          pGVar3->Value = pGVar3->Value + 1;
        }
        pGVar3 = Gia_ObjFanin1(pGStack_18);
        iVar1 = Gia_ObjIsAndNotBuf(pGVar3);
        if (iVar1 != 0) {
          pGVar3 = Gia_ObjFanin1(pGStack_18);
          pGVar3->Value = pGVar3->Value + 1;
        }
        iVar1 = Gia_ObjIsMuxId(p->pGia,local_1c);
        if (iVar1 != 0) {
          pGVar3 = Gia_ObjFanin2(p->pGia,pGStack_18);
          iVar1 = Gia_ObjIsAndNotBuf(pGVar3);
          if (iVar1 != 0) {
            pGVar3 = Gia_ObjFanin2(p->pGia,pGStack_18);
            pGVar3->Value = pGVar3->Value + 1;
          }
        }
        iVar1 = Gia_ObjSibl(p->pGia,local_1c);
        if (iVar1 != 0) {
          pGVar3 = Gia_ObjSiblObj(p->pGia,local_1c);
          iVar1 = Gia_ObjIsAndNotBuf(pGVar3);
          if (iVar1 != 0) {
            pGVar3 = Gia_ObjSiblObj(p->pGia,local_1c);
            pGVar3->Value = pGVar3->Value + 1;
          }
        }
      }
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Lf_ManSetCutRefs( Lf_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    if ( Vec_PtrSize(&p->vMemSets) * (1 << LF_LOG_PAGE) != Vec_IntSize(&p->vFreeSets) )
        printf( "The number of used cutsets = %d.\n", Vec_PtrSize(&p->vMemSets) * (1 << LF_LOG_PAGE) - Vec_IntSize(&p->vFreeSets) );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        assert( pObj->Value == 0 );
        if ( Gia_ObjIsBuf(pObj) )
            continue;
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin0(pObj)) )
            Gia_ObjFanin0(pObj)->Value++;
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin1(pObj)) )
            Gia_ObjFanin1(pObj)->Value++;
        if ( Gia_ObjIsMuxId(p->pGia, i) && Gia_ObjIsAndNotBuf(Gia_ObjFanin2(p->pGia, pObj)) )
            Gia_ObjFanin2(p->pGia, pObj)->Value++;
        if ( Gia_ObjSibl(p->pGia, i) && Gia_ObjIsAndNotBuf(Gia_ObjSiblObj(p->pGia, i)) )
            Gia_ObjSiblObj(p->pGia, i)->Value++;
    }
}